

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int a;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int32_t iVar21;
  fpclass_type fVar22;
  int32_t iVar23;
  bool bVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar29;
  long lVar30;
  bool bVar31;
  
  lVar25 = 2;
  do {
    iVar2 = SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[lVar25];
    lVar26 = (long)start + (long)iVar2;
    lVar30 = lVar26;
    iVar28 = start;
    if ((int)lVar26 <= end) {
      do {
        uVar6 = *(undefined8 *)keys[lVar30].val.m_backend.data._M_elems;
        uVar7 = *(undefined8 *)(keys[lVar30].val.m_backend.data._M_elems + 2);
        puVar1 = keys[lVar30].val.m_backend.data._M_elems + 4;
        uVar8 = *(undefined8 *)puVar1;
        uVar9 = *(undefined8 *)(puVar1 + 2);
        puVar1 = keys[lVar30].val.m_backend.data._M_elems + 8;
        uVar10 = *(undefined8 *)puVar1;
        uVar11 = *(undefined8 *)(puVar1 + 2);
        puVar1 = keys[lVar30].val.m_backend.data._M_elems + 0xc;
        uVar12 = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        iVar3 = keys[lVar30].val.m_backend.exp;
        bVar31 = keys[lVar30].val.m_backend.neg;
        fVar22 = keys[lVar30].val.m_backend.fpclass;
        iVar23 = keys[lVar30].val.m_backend.prec_elem;
        a = keys[lVar30].idx;
        iVar27 = (int)lVar30;
        iVar5 = iVar28;
        if (lVar26 <= lVar30) {
          do {
            bVar24 = EQ(a,keys[iVar5].idx);
            iVar27 = iVar5;
            if ((bVar24) || (iVar4 = keys[iVar5].idx, iVar4 <= a)) break;
            iVar27 = iVar2 + iVar5;
            pNVar29 = keys + iVar5;
            uVar14 = *(undefined8 *)(pNVar29->val).m_backend.data._M_elems;
            uVar15 = *(undefined8 *)((pNVar29->val).m_backend.data._M_elems + 2);
            uVar16 = *(undefined8 *)((pNVar29->val).m_backend.data._M_elems + 4);
            uVar17 = *(undefined8 *)((pNVar29->val).m_backend.data._M_elems + 6);
            uVar18 = *(undefined8 *)((pNVar29->val).m_backend.data._M_elems + 8);
            uVar19 = *(undefined8 *)((pNVar29->val).m_backend.data._M_elems + 10);
            uVar20 = *(undefined8 *)((pNVar29->val).m_backend.data._M_elems + 0xe);
            puVar1 = keys[iVar27].val.m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar1 = *(undefined8 *)((pNVar29->val).m_backend.data._M_elems + 0xc);
            *(undefined8 *)(puVar1 + 2) = uVar20;
            puVar1 = keys[iVar27].val.m_backend.data._M_elems + 8;
            *(undefined8 *)puVar1 = uVar18;
            *(undefined8 *)(puVar1 + 2) = uVar19;
            puVar1 = keys[iVar27].val.m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = uVar16;
            *(undefined8 *)(puVar1 + 2) = uVar17;
            *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems = uVar14;
            *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2) = uVar15;
            keys[iVar27].val.m_backend.exp = (pNVar29->val).m_backend.exp;
            keys[iVar27].val.m_backend.neg = (pNVar29->val).m_backend.neg;
            iVar21 = (pNVar29->val).m_backend.prec_elem;
            keys[iVar27].val.m_backend.fpclass = (pNVar29->val).m_backend.fpclass;
            keys[iVar27].val.m_backend.prec_elem = iVar21;
            keys[iVar27].idx = iVar4;
            iVar27 = iVar5 - iVar2;
            bVar24 = (int)lVar26 <= iVar5;
            iVar5 = iVar27;
          } while (bVar24);
          iVar27 = iVar27 + iVar2;
        }
        puVar1 = keys[iVar27].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar1 = uVar12;
        *(undefined8 *)(puVar1 + 2) = uVar13;
        puVar1 = keys[iVar27].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar1 = uVar10;
        *(undefined8 *)(puVar1 + 2) = uVar11;
        puVar1 = keys[iVar27].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = uVar8;
        *(undefined8 *)(puVar1 + 2) = uVar9;
        *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems = uVar6;
        *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2) = uVar7;
        keys[iVar27].val.m_backend.exp = iVar3;
        keys[iVar27].val.m_backend.neg = bVar31;
        keys[iVar27].val.m_backend.fpclass = fVar22;
        keys[iVar27].val.m_backend.prec_elem = iVar23;
        keys[iVar27].idx = a;
        lVar30 = lVar30 + 1;
        iVar28 = iVar28 + 1;
      } while (end + 1 != (int)lVar30);
    }
    bVar31 = lVar25 == 0;
    lVar25 = lVar25 + -1;
    if (bVar31) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}